

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  pointer *__ptr;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  long *local_bc8;
  string expression;
  string out_fname;
  Scope scope;
  ofstream asm_out;
  Parser parser;
  
  expression._M_dataplus._M_p = (pointer)&expression.field_2;
  expression._M_string_length = 0;
  expression.field_2._M_local_buf[0] = '\0';
  if ((argc < 2) || ((pcVar1 = argv[1], *pcVar1 == '-' && (pcVar1[1] == '\0')))) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&expression);
  }
  else {
    std::ifstream::ifstream(&parser,pcVar1,_S_in);
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf =
         *(streambuf_type **)
          (&parser.RegexMinus._M_loc + *(long *)(parser.RegexLeftParen._0_8_ + -0x18));
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)&expression,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
    std::ifstream::~ifstream(&parser);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Input:\n");
  poVar2 = std::operator<<(poVar2,(string *)&expression);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out_fname,argv[1],(allocator<char> *)&parser);
  std::__cxx11::string::append((char *)&out_fname);
  std::ofstream::ofstream(&asm_out,(string *)&out_fname,_S_out);
  VPLGrammar::Parser::Parser(&parser);
  VPLGrammar::Parser::Parse((Parser *)&local_bc8,(string *)&parser);
  (**(code **)(*local_bc8 + 0x20))(local_bc8,&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vpl::Scope::Scope(&scope,(ostream *)&asm_out);
  (**(code **)(*local_bc8 + 0x28))(local_bc8,&scope,&asm_out);
  vpl::Scope::~Scope(&scope);
  if (local_bc8 != (long *)0x0) {
    (**(code **)(*local_bc8 + 8))();
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  VPLGrammar::Parser::~Parser(&parser);
  std::ofstream::~ofstream(&asm_out);
  std::__cxx11::string::~string((string *)&out_fname);
  std::__cxx11::string::~string((string *)&expression);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    std::string expression;

    if (argc > 1 && std::strcmp(argv[1], "-") != 0) {
        std::ifstream fin(argv[1]);
        expression.assign((std::istreambuf_iterator<char>(fin)), (std::istreambuf_iterator<char>()));
    } else {
        std::getline(std::cin, expression);
    }
    std::cerr << "Input:\n" << expression << std::endl;

    std::string out_fname = argv[1];
    out_fname += ".vasm";
    std::ofstream asm_out(out_fname);

    VPLGrammar::Parser parser;
    try {
        auto expr = parser.Parse(expression);
        expr->Print(std::cout);
        std::cout << std::endl;

        vpl::Scope scope(asm_out);
        expr->BuildProgram(&scope, asm_out);
    } catch (std::exception& ex) {
        std::cout << ex.what();
    }
    std::cout << std::endl;
    return 0;
}